

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

uint GetStorageIndex(InstructionVMEvalContext *ctx,Storage *storage)

{
  uint uVar1;
  Storage *local_20;
  Storage *storage_local;
  InstructionVMEvalContext *ctx_local;
  
  if (storage->index == 0) {
    local_20 = storage;
    storage_local = (Storage *)ctx;
    SmallArray<InstructionVMEvalContext::Storage_*,_32U>::push_back(&ctx->storageSet,&local_20);
    uVar1 = SmallArray<InstructionVMEvalContext::Storage_*,_32U>::size
                      ((SmallArray<InstructionVMEvalContext::Storage_*,_32U> *)
                       (storage_local[2].data.little + 0x70));
    local_20->index = uVar1;
    ctx_local._4_4_ = local_20->index;
  }
  else {
    ctx_local._4_4_ = storage->index;
  }
  return ctx_local._4_4_;
}

Assistant:

unsigned GetStorageIndex(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage)
{
	if(storage->index != 0)
		return storage->index;

	ctx.storageSet.push_back(storage);
	storage->index = ctx.storageSet.size();

	return storage->index;
}